

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flat_hash_map_test.cc
# Opt level: O3

void __thiscall
phmap::priv::anon_unknown_5::ParallelNodeHashMap_IteratesMsan_Test::TestBody
          (ParallelNodeHashMap_IteratesMsan_Test *this)

{
  ostream *os;
  pair<const_int,_phmap::priv::(anonymous_namespace)::balast> *x;
  ushort uVar1;
  byte bVar2;
  allocator_type *__p;
  undefined8 uVar3;
  anon_union_8_1_a8a14541_for_iterator_1 aVar4;
  bool bVar5;
  int iVar6;
  long lVar7;
  size_t i;
  int *piVar8;
  undefined8 *puVar9;
  ostream *poVar10;
  AssertionResult *other;
  ulong uVar11;
  allocator_type *__a;
  ulong uVar12;
  ulong hashval;
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  *__args;
  type_info *type;
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  *extraout_RDX;
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  *ppVar13;
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  *extraout_RDX_00;
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  *extraout_RDX_01;
  uint uVar14;
  char *pcVar15;
  uint uVar16;
  ulong uVar17;
  raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
  *this_00;
  ulong uVar18;
  __m128i match;
  undefined1 auVar19 [16];
  char cVar23;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined1 auVar24 [16];
  vector<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
  garbage;
  Matcher<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&> matcher;
  iterator it;
  StringMatchResultListener inner_listener;
  StringMatchResultListener listener;
  ThisMap<int,_balast> t;
  stringstream ss;
  undefined1 local_8c8 [8];
  _Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_8c0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_8b8;
  undefined1 local_8a8 [16];
  allocator_type *local_898;
  undefined1 local_890 [8];
  __uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_888;
  int local_87c;
  allocator_type *local_878;
  allocator_type *local_870;
  ios_base *local_868;
  ios_base *local_860;
  MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&> local_858;
  iterator local_840;
  long *local_810;
  long local_808;
  long local_800 [2];
  ulong local_7f0;
  undefined1 local_7e8 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_7d8;
  undefined1 local_7c8 [112];
  ios_base aiStack_758 [264];
  AssertHelper local_650;
  ostream *local_648;
  stringstream local_640 [16];
  ostream local_630 [112];
  ios_base aiStack_5c0 [264];
  parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
  local_4b8;
  undefined1 local_1b8 [128];
  ios_base local_138 [264];
  char cVar25;
  char cVar26;
  char cVar27;
  
  local_8a8 = (undefined1  [16])0x0;
  local_898 = (allocator_type *)0x0;
  os = (ostream *)(local_1b8 + 0x10);
  local_868 = aiStack_758;
  local_860 = aiStack_5c0;
  iVar6 = 0;
  do {
    lVar7 = 0;
    do {
      *(undefined1 **)
       ((long)&local_4b8.
               super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .
               super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .sets_._M_elems[0].set_ + lVar7) =
           &EmptyGroup<std::is_same<std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>>>()
            ::empty_group;
      *(undefined8 *)
       ((long)&local_4b8.
               super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .
               super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .sets_._M_elems[0].set_ + lVar7 + 0x28) = 0;
      *(undefined1 (*) [16])
       ((long)&local_4b8.
               super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .
               super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .sets_._M_elems[0].set_ + lVar7 + 8) = (undefined1  [16])0x0;
      *(undefined8 *)
       ((long)&local_4b8.
               super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .
               super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
               .sets_._M_elems[0].set_ + lVar7 + 0x18) = 0;
      lVar7 = lVar7 + 0x30;
    } while (lVar7 != 0x300);
    uVar11 = 0;
    local_87c = iVar6;
    do {
      iVar6 = (int)uVar11;
      auVar19._8_8_ = 0;
      auVar19._0_8_ = uVar11;
      hashval = SUB168(auVar19 * ZEXT816(0xde5fb9d2630458e9),8) +
                SUB168(auVar19 * ZEXT816(0xde5fb9d2630458e9),0);
      uVar18 = (ulong)((((uint)(hashval >> 0x18) & 0xff ^
                        (uint)(hashval >> 8) & 0xffffff ^ (uint)(hashval >> 0x10) & 0xffff) & 0xf) *
                      0x30);
      uVar11 = *(ulong *)((long)&local_4b8.
                                 super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                                 .
                                 super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                                 .sets_._M_elems[0].set_ + uVar18 + 0x18);
      if ((uVar11 + 1 & uVar11) != 0) {
        __assert_fail("((mask + 1) & mask) == 0 && \"not a mask\"",
                      "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/parallel_hashmap/phmap.h"
                      ,0x95,"phmap::priv::probe_seq<16>::probe_seq(size_t, size_t) [Width = 16]");
      }
      this_00 = (raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                 *)((long)&local_4b8.
                           super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                           .
                           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                           .sets_._M_elems[0].set_ + uVar18);
      uVar12 = hashval >> 7;
      bVar2 = (byte)hashval;
      auVar19 = ZEXT216(CONCAT11(bVar2,bVar2) & 0x7f7f);
      auVar19 = pshuflw(auVar19,auVar19,0);
      lVar7 = 0;
      while( true ) {
        uVar12 = uVar12 & uVar11;
        auVar21 = *(undefined1 (*) [16])(this_00->ctrl_ + uVar12);
        cVar23 = auVar19[0];
        auVar24[0] = -(cVar23 == auVar21[0]);
        cVar25 = auVar19[1];
        auVar24[1] = -(cVar25 == auVar21[1]);
        cVar26 = auVar19[2];
        auVar24[2] = -(cVar26 == auVar21[2]);
        cVar27 = auVar19[3];
        auVar24[3] = -(cVar27 == auVar21[3]);
        auVar24[4] = -(cVar23 == auVar21[4]);
        auVar24[5] = -(cVar25 == auVar21[5]);
        auVar24[6] = -(cVar26 == auVar21[6]);
        auVar24[7] = -(cVar27 == auVar21[7]);
        auVar24[8] = -(cVar23 == auVar21[8]);
        auVar24[9] = -(cVar25 == auVar21[9]);
        auVar24[10] = -(cVar26 == auVar21[10]);
        auVar24[0xb] = -(cVar27 == auVar21[0xb]);
        auVar24[0xc] = -(cVar23 == auVar21[0xc]);
        auVar24[0xd] = -(cVar25 == auVar21[0xd]);
        auVar24[0xe] = -(cVar26 == auVar21[0xe]);
        cVar23 = auVar21[0xf];
        auVar24[0xf] = -(cVar27 == cVar23);
        uVar1 = (ushort)(SUB161(auVar24 >> 7,0) & 1) | (ushort)(SUB161(auVar24 >> 0xf,0) & 1) << 1 |
                (ushort)(SUB161(auVar24 >> 0x17,0) & 1) << 2 |
                (ushort)(SUB161(auVar24 >> 0x1f,0) & 1) << 3 |
                (ushort)(SUB161(auVar24 >> 0x27,0) & 1) << 4 |
                (ushort)(SUB161(auVar24 >> 0x2f,0) & 1) << 5 |
                (ushort)(SUB161(auVar24 >> 0x37,0) & 1) << 6 |
                (ushort)(SUB161(auVar24 >> 0x3f,0) & 1) << 7 |
                (ushort)(SUB161(auVar24 >> 0x47,0) & 1) << 8 |
                (ushort)(SUB161(auVar24 >> 0x4f,0) & 1) << 9 |
                (ushort)(SUB161(auVar24 >> 0x57,0) & 1) << 10 |
                (ushort)(SUB161(auVar24 >> 0x5f,0) & 1) << 0xb |
                (ushort)(SUB161(auVar24 >> 0x67,0) & 1) << 0xc |
                (ushort)(SUB161(auVar24 >> 0x6f,0) & 1) << 0xd |
                (ushort)(SUB161(auVar24 >> 0x77,0) & 1) << 0xe | (ushort)(auVar24[0xf] >> 7) << 0xf;
        if (uVar1 != 0) {
          uVar16 = (uint)uVar1;
          do {
            uVar14 = 0;
            if (uVar16 != 0) {
              for (; (uVar16 >> uVar14 & 1) == 0; uVar14 = uVar14 + 1) {
              }
            }
            uVar17 = uVar14 + uVar12 & uVar11;
            if (**(int **)(*(long *)((long)&local_4b8.
                                            super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                                            .
                                            super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                                            .sets_._M_elems[0].set_ + uVar18 + 8) + uVar17 * 8) ==
                iVar6) {
              if (uVar17 != 0xffffffffffffffff) goto LAB_001313eb;
              goto LAB_001313b7;
            }
            uVar16 = uVar16 - 1 & uVar16;
          } while (uVar16 != 0);
        }
        auVar20[0] = -(auVar21[0] == -0x80);
        auVar20[1] = -(auVar21[1] == -0x80);
        auVar20[2] = -(auVar21[2] == -0x80);
        auVar20[3] = -(auVar21[3] == -0x80);
        auVar20[4] = -(auVar21[4] == -0x80);
        auVar20[5] = -(auVar21[5] == -0x80);
        auVar20[6] = -(auVar21[6] == -0x80);
        auVar20[7] = -(auVar21[7] == -0x80);
        auVar20[8] = -(auVar21[8] == -0x80);
        auVar20[9] = -(auVar21[9] == -0x80);
        auVar20[10] = -(auVar21[10] == -0x80);
        auVar20[0xb] = -(auVar21[0xb] == -0x80);
        auVar20[0xc] = -(auVar21[0xc] == -0x80);
        auVar20[0xd] = -(auVar21[0xd] == -0x80);
        auVar20[0xe] = -(auVar21[0xe] == -0x80);
        auVar20[0xf] = -(cVar23 == -0x80);
        if ((((((((((((((((auVar20 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                         (auVar20 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                        (auVar20 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                       (auVar20 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                      (auVar20 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                     (auVar20 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar20 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar20 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar20 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar20 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar20 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar20 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar20 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar20 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar20 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar23 == -0x80)
        break;
        uVar12 = uVar12 + lVar7 + 0x10;
        lVar7 = lVar7 + 0x10;
      }
LAB_001313b7:
      i = raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
          ::prepare_insert(this_00,hashval);
      lVar7 = *(long *)((long)&local_4b8.
                               super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                               .
                               super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                               .sets_._M_elems[0].set_ + uVar18 + 8);
      piVar8 = (int *)operator_new(8);
      *piVar8 = iVar6;
      *(int **)(lVar7 + i * 8) = piVar8;
      raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
      ::set_ctrl(this_00,i,bVar2 & 0x7f);
LAB_001313eb:
      cVar23 = *local_4b8.
                super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                .
                super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                .sets_._M_elems[0].set_.ctrl_;
      local_840.it_.ctrl_ =
           local_4b8.
           super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .
           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .sets_._M_elems[0].set_.ctrl_;
      local_840.it_.field_1.slot_ =
           local_4b8.
           super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .
           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .sets_._M_elems[0].set_.slots_;
      while (cVar23 < -1) {
        auVar21[0] = -(*local_840.it_.ctrl_ < -1);
        auVar21[1] = -(local_840.it_.ctrl_[1] < -1);
        auVar21[2] = -(local_840.it_.ctrl_[2] < -1);
        auVar21[3] = -(local_840.it_.ctrl_[3] < -1);
        auVar21[4] = -(local_840.it_.ctrl_[4] < -1);
        auVar21[5] = -(local_840.it_.ctrl_[5] < -1);
        auVar21[6] = -(local_840.it_.ctrl_[6] < -1);
        auVar21[7] = -(local_840.it_.ctrl_[7] < -1);
        auVar21[8] = -(local_840.it_.ctrl_[8] < -1);
        auVar21[9] = -(local_840.it_.ctrl_[9] < -1);
        auVar21[10] = -(local_840.it_.ctrl_[10] < -1);
        auVar21[0xb] = -(local_840.it_.ctrl_[0xb] < -1);
        auVar21[0xc] = -(local_840.it_.ctrl_[0xc] < -1);
        auVar21[0xd] = -(local_840.it_.ctrl_[0xd] < -1);
        auVar21[0xe] = -(local_840.it_.ctrl_[0xe] < -1);
        auVar21[0xf] = -(local_840.it_.ctrl_[0xf] < -1);
        uVar14 = (ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                          (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                          (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                          (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                          (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                          (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                          (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                          (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                          (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                          (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                          (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                          (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                          (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe |
                         (ushort)(auVar21[0xf] >> 7) << 0xf) + 1;
        uVar16 = 0;
        if (uVar14 != 0) {
          for (; (uVar14 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
          }
        }
        local_840.it_.field_1.slot_ = local_840.it_.field_1.slot_ + uVar16;
        cVar23 = local_840.it_.ctrl_[uVar16];
        local_840.it_.ctrl_ = local_840.it_.ctrl_ + uVar16;
      }
      local_840.inner_ = (Inner *)&local_4b8;
      local_840.inner_end_ = (Inner *)local_1b8;
      local_840.it_end_.ctrl_ =
           local_4b8.
           super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .
           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .sets_._M_elems[0].set_.ctrl_ +
           local_4b8.
           super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .
           super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
           .sets_._M_elems[0].set_.capacity_;
      while (parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
             ::iterator::skip_empty(&local_840), aVar4 = local_840.it_.field_1,
            (parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
             *)local_840.inner_ !=
            (parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
             *)0x0) {
        x = *local_840.it_.field_1.slot_;
        puVar9 = (undefined8 *)operator_new(0x38);
        *puVar9 = &PTR__PairMatcherImpl_00335680;
        puVar9[3] = 0;
        puVar9[2] = testing::internal::MatcherBase<int_const&>::
                    GetVTable<testing::internal::MatcherBase<int_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
                    ::kVTable;
        puVar9[1] = &PTR__MatcherBase_00336168;
        puVar9[6] = 0;
        puVar9[5] = testing::internal::
                    MatcherBase<phmap::priv::(anonymous_namespace)::balast_const&>::
                    GetVTable<testing::internal::MatcherBase<phmap::priv::(anonymous_namespace)::balast_const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
                    ::kVTable;
        puVar9[4] = &PTR__MatcherBase_003356e8;
        local_858.vtable_ =
             (VTable *)
             testing::internal::
             MatcherBase<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>const&>::
             GetVTable<testing::internal::MatcherBase<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>const&>::ValuePolicy<testing::MatcherInterface<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>const&>const*,true>>()
             ::kVTable;
        local_858.buffer_.ptr = operator_new(0x10);
        ((local_858.buffer_.shared)->ref).super___atomic_base<int>._M_i = 1;
        *(undefined8 **)(local_858.buffer_.i + 8) = puVar9;
        local_858.super_MatcherDescriberInterface._vptr_MatcherDescriberInterface =
             (_func_int **)&PTR__MatcherBase_003357a8;
        local_7e8._8_8_ = (undefined1 *)0x0;
        local_7e8._0_8_ = &PTR__MatchResultListener_00336228;
        bVar5 = testing::internal::
                MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                ::MatchAndExplain(&local_858,x,(MatchResultListener *)local_7e8);
        if (bVar5) {
          testing::AssertionSuccess();
        }
        else {
          std::__cxx11::stringstream::stringstream((stringstream *)local_1b8);
          std::__ostream_insert<char,std::char_traits<char>>(os,"Value of: ",10);
          std::__ostream_insert<char,std::char_traits<char>>(os,"p",1);
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n",1);
          std::__ostream_insert<char,std::char_traits<char>>(os,"Expected: ",10);
          testing::internal::
          MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>::
          DescribeTo(&local_858,os);
          local_648 = local_630;
          local_650.data_ = (AssertHelperData *)&PTR__StringMatchResultListener_00336270;
          std::__cxx11::stringstream::stringstream(local_640);
          if (local_648 == (ostream *)0x0) {
            local_7e8._8_8_ = (undefined1 *)0x0;
            local_7e8._0_8_ = &PTR__MatchResultListener_00336228;
            bVar5 = testing::internal::
                    MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                    ::MatchAndExplain(&local_858,x,(MatchResultListener *)local_7e8);
            if (bVar5) goto LAB_00131829;
          }
          else {
            local_7e8._8_8_ = local_7c8;
            local_7e8._0_8_ = &PTR__StringMatchResultListener_00336270;
            std::__cxx11::stringstream::stringstream((stringstream *)(local_7e8 + 0x10));
            bVar5 = testing::internal::
                    MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>
                    ::MatchAndExplain(&local_858,x,(MatchResultListener *)local_7e8);
            poVar10 = local_648;
            local_8c8[0] = '(';
            std::__ostream_insert<char,std::char_traits<char>>(local_648,local_8c8,1);
            std::ostream::operator<<((ostream *)poVar10,x->first);
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,", ",2);
            testing::internal::PrintBytesInObjectTo(&x->field_0x4,1,poVar10);
            local_8c8[0] = ')';
            std::__ostream_insert<char,std::char_traits<char>>(poVar10,local_8c8,1);
            testing::internal::GetTypeName_abi_cxx11_
                      ((string *)local_8c8,
                       (internal *)
                       &std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>::typeinfo,
                       type);
            if ((local_8c0._M_head_impl < 0x15) ||
               (lVar7 = std::__cxx11::string::find_first_of(local_8c8,0x2944d1,0), lVar7 == -1)) {
              poVar10 = local_648;
              std::__ostream_insert<char,std::char_traits<char>>(local_648," (of type ",10);
              poVar10 = std::__ostream_insert<char,std::char_traits<char>>
                                  (poVar10,(char *)CONCAT71(local_8c8._1_7_,local_8c8[0]),
                                   (long)local_8c0._M_head_impl);
              std::__ostream_insert<char,std::char_traits<char>>(poVar10,")",1);
            }
            std::__cxx11::stringbuf::str();
            poVar10 = local_648;
            if ((local_648 != (ostream *)0x0) && (local_808 != 0)) {
              std::__ostream_insert<char,std::char_traits<char>>(local_648,", ",2);
              std::__ostream_insert<char,std::char_traits<char>>
                        (poVar10,(char *)local_810,local_808);
            }
            if (local_810 != local_800) {
              operator_delete(local_810,local_800[0] + 1);
            }
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT71(local_8c8._1_7_,local_8c8[0]) != &local_8b8) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT71(local_8c8._1_7_,local_8c8[0]),
                              local_8b8._M_allocated_capacity + 1);
            }
            local_7e8._0_8_ = &PTR__StringMatchResultListener_00336270;
            std::__cxx11::stringstream::~stringstream((stringstream *)(local_7e8 + 0x10));
            std::ios_base::~ios_base(local_868);
            if (bVar5) {
LAB_00131829:
              std::__ostream_insert<char,std::char_traits<char>>
                        (os,
                         "\n  The matcher failed on the initial attempt; but passed when rerun to generate the explanation."
                         ,0x60);
            }
          }
          std::__ostream_insert<char,std::char_traits<char>>(os,"\n  Actual: ",0xb);
          std::__cxx11::stringbuf::str();
          std::__ostream_insert<char,std::char_traits<char>>
                    (os,(char *)local_7e8._0_8_,local_7e8._8_8_);
          if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
            operator_delete((void *)local_7e8._0_8_,local_7d8._M_allocated_capacity + 1);
          }
          testing::AssertionFailure();
          std::__cxx11::stringbuf::str();
          other = testing::AssertionResult::operator<<
                            ((AssertionResult *)local_8c8,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             local_7e8);
          testing::AssertionResult::AssertionResult((AssertionResult *)local_890,other);
          if ((undefined1 *)local_7e8._0_8_ != local_7e8 + 0x10) {
            operator_delete((void *)local_7e8._0_8_,local_7d8._M_allocated_capacity + 1);
          }
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_8c0._M_head_impl !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
            std::
            default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                          *)&local_8c0,local_8c0._M_head_impl);
          }
          local_650.data_ = (AssertHelperData *)&PTR__StringMatchResultListener_00336270;
          std::__cxx11::stringstream::~stringstream(local_640);
          std::ios_base::~ios_base(local_860);
          std::__cxx11::stringstream::~stringstream((stringstream *)local_1b8);
          std::ios_base::~ios_base(local_138);
        }
        testing::internal::
        MatcherBase<const_std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_&>::
        ~MatcherBase(&local_858);
        if ((bool)local_890[0] == false) {
          testing::Message::Message((Message *)local_7e8);
          pcVar15 = "";
          if ((__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )local_888._M_t.
                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                .
                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                ._M_head_impl !=
              (__uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               )0x0) {
            pcVar15 = *(char **)local_888._M_t.
                                super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                .
                                super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                                ._M_head_impl;
          }
          testing::internal::AssertHelper::AssertHelper
                    (&local_650,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_c_cmakelists/greg7mdp[P]parallel-hashmap/tests/flat_hash_map_test.cc"
                     ,0x86,pcVar15);
          testing::internal::AssertHelper::operator=(&local_650,(Message *)local_7e8);
          testing::internal::AssertHelper::~AssertHelper(&local_650);
          if ((undefined **)local_7e8._0_8_ != (undefined **)0x0) {
            (**(code **)(*(undefined **)local_7e8._0_8_ + 8))();
          }
        }
        if (local_888._M_t.
            super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            .
            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
            ._M_head_impl !=
            (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )0x0) {
          std::
          default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                        *)&local_888,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_888._M_t.
                       super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       .
                       super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                       ._M_head_impl);
        }
        local_840.it_.field_1.slot_ = aVar4.slot_ + 1;
        cVar23 = local_840.it_.ctrl_[1];
        local_840.it_.ctrl_ = local_840.it_.ctrl_ + 1;
        while (cVar23 < -1) {
          auVar22[0] = -(*local_840.it_.ctrl_ < -1);
          auVar22[1] = -(local_840.it_.ctrl_[1] < -1);
          auVar22[2] = -(local_840.it_.ctrl_[2] < -1);
          auVar22[3] = -(local_840.it_.ctrl_[3] < -1);
          auVar22[4] = -(local_840.it_.ctrl_[4] < -1);
          auVar22[5] = -(local_840.it_.ctrl_[5] < -1);
          auVar22[6] = -(local_840.it_.ctrl_[6] < -1);
          auVar22[7] = -(local_840.it_.ctrl_[7] < -1);
          auVar22[8] = -(local_840.it_.ctrl_[8] < -1);
          auVar22[9] = -(local_840.it_.ctrl_[9] < -1);
          auVar22[10] = -(local_840.it_.ctrl_[10] < -1);
          auVar22[0xb] = -(local_840.it_.ctrl_[0xb] < -1);
          auVar22[0xc] = -(local_840.it_.ctrl_[0xc] < -1);
          auVar22[0xd] = -(local_840.it_.ctrl_[0xd] < -1);
          auVar22[0xe] = -(local_840.it_.ctrl_[0xe] < -1);
          auVar22[0xf] = -(local_840.it_.ctrl_[0xf] < -1);
          uVar14 = (ushort)((ushort)(SUB161(auVar22 >> 7,0) & 1) |
                            (ushort)(SUB161(auVar22 >> 0xf,0) & 1) << 1 |
                            (ushort)(SUB161(auVar22 >> 0x17,0) & 1) << 2 |
                            (ushort)(SUB161(auVar22 >> 0x1f,0) & 1) << 3 |
                            (ushort)(SUB161(auVar22 >> 0x27,0) & 1) << 4 |
                            (ushort)(SUB161(auVar22 >> 0x2f,0) & 1) << 5 |
                            (ushort)(SUB161(auVar22 >> 0x37,0) & 1) << 6 |
                            (ushort)(SUB161(auVar22 >> 0x3f,0) & 1) << 7 |
                            (ushort)(SUB161(auVar22 >> 0x47,0) & 1) << 8 |
                            (ushort)(SUB161(auVar22 >> 0x4f,0) & 1) << 9 |
                            (ushort)(SUB161(auVar22 >> 0x57,0) & 1) << 10 |
                            (ushort)(SUB161(auVar22 >> 0x5f,0) & 1) << 0xb |
                            (ushort)(SUB161(auVar22 >> 0x67,0) & 1) << 0xc |
                            (ushort)(SUB161(auVar22 >> 0x6f,0) & 1) << 0xd |
                            (ushort)(SUB161(auVar22 >> 0x77,0) & 1) << 0xe |
                           (ushort)(auVar22[0xf] >> 7) << 0xf) + 1;
          uVar16 = 0;
          if (uVar14 != 0) {
            for (; (uVar14 >> uVar16 & 1) == 0; uVar16 = uVar16 + 1) {
            }
          }
          pcVar15 = local_840.it_.ctrl_ + uVar16;
          local_840.it_.ctrl_ = local_840.it_.ctrl_ + uVar16;
          local_840.it_.field_1.slot_ = local_840.it_.field_1.slot_ + uVar16;
          cVar23 = *pcVar15;
        }
      }
      uVar11 = (ulong)(iVar6 + 1U);
    } while (iVar6 + 1U != 100);
    uVar3 = local_8a8._8_8_;
    if ((allocator_type *)local_8a8._8_8_ == local_898) {
      __p = (allocator_type *)local_8a8._0_8_;
      if (local_8a8._8_8_ - local_8a8._0_8_ == 0x7ffffffffffffe00) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      lVar7 = (long)(local_8a8._8_8_ - local_8a8._0_8_) >> 8;
      uVar18 = lVar7 * -0x5555555555555555;
      uVar11 = uVar18;
      if (local_8a8._8_8_ == local_8a8._0_8_) {
        uVar11 = 1;
      }
      local_7f0 = uVar11 + uVar18;
      if (0x2aaaaaaaaaaaa9 < local_7f0) {
        local_7f0 = 0x2aaaaaaaaaaaaa;
      }
      if (CARRY8(uVar11,uVar18)) {
        local_7f0 = 0x2aaaaaaaaaaaaa;
      }
      if (local_7f0 == 0) {
        __a = (allocator_type *)0x0;
        ppVar13 = __args;
      }
      else {
        __a = (allocator_type *)operator_new(local_7f0 * 0x300);
        ppVar13 = extraout_RDX;
      }
      std::
      allocator_traits<std::allocator<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>>
      ::
      construct<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>,phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>
                (__a + lVar7 * 0x100,&local_4b8,ppVar13);
      ppVar13 = extraout_RDX_00;
      local_878 = __a;
      local_870 = __p;
      while ((allocator_type *)uVar3 != __p) {
        std::
        allocator_traits<std::allocator<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>>
        ::
        construct<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>,phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>
                  (__a,(parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>
                        *)__p,ppVar13);
        lVar7 = 0x2d0;
        do {
          raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
          ::~raw_hash_set((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                           *)(__p + lVar7));
          lVar7 = lVar7 + -0x30;
        } while (lVar7 != -0x30);
        __a = __a + 0x300;
        ppVar13 = extraout_RDX_01;
        __p = __p + 0x300;
      }
      if (local_870 != (allocator_type *)0x0) {
        operator_delete(local_870,(long)local_898 - (long)local_870);
      }
      local_8a8._8_8_ = __a + 0x300;
      local_8a8._0_8_ = local_878;
      local_898 = local_878 + local_7f0 * 0x300;
    }
    else {
      std::
      allocator_traits<std::allocator<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>>
      ::
      construct<phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>,phmap::parallel_node_hash_map<int,phmap::priv::(anonymous_namespace)::balast,phmap::Hash<int>,phmap::EqualTo<int>,std::allocator<std::pair<int_const,phmap::priv::(anonymous_namespace)::balast>>,4ul,phmap::NullMutex>>
                ((allocator_type *)local_8a8._8_8_,&local_4b8,__args);
      local_8a8._8_8_ = (allocator_type *)(uVar3 + 0x300);
    }
    lVar7 = 0x2d0;
    do {
      raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
      ::~raw_hash_set((raw_hash_set<phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                       *)((long)&local_4b8.
                                 super_parallel_hash_map<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                                 .
                                 super_parallel_hash_set<4UL,_phmap::priv::raw_hash_set,_phmap::NullMutex,_phmap::priv::NodeHashMapPolicy<int,_phmap::priv::(anonymous_namespace)::balast>,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>_>
                                 .sets_._M_elems[0].set_ + lVar7));
      lVar7 = lVar7 + -0x30;
    } while (lVar7 != -0x30);
    iVar6 = local_87c + 1;
    if (iVar6 == 100) {
      std::
      vector<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
      ::~vector((vector<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>,_std::allocator<phmap::parallel_node_hash_map<int,_phmap::priv::(anonymous_namespace)::balast,_phmap::Hash<int>,_phmap::EqualTo<int>,_std::allocator<std::pair<const_int,_phmap::priv::(anonymous_namespace)::balast>_>,_4UL,_phmap::NullMutex>_>_>
                 *)local_8a8);
      return;
    }
  } while( true );
}

Assistant:

bool operator==(const Int& other) const { return value == other.value; }